

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymmetricAlgorithm.cpp
# Opt level: O0

bool __thiscall SymmetricAlgorithm::generateKey(SymmetricAlgorithm *this,SymmetricKey *key,RNG *rng)

{
  byte bVar1;
  long lVar2;
  ulong uVar3;
  long *in_RDX;
  long *in_RSI;
  ByteString keyBits;
  undefined1 local_48 [40];
  long *local_20;
  long *local_18;
  byte local_1;
  
  if (in_RDX == (long *)0x0) {
    local_1 = 0;
  }
  else {
    local_20 = in_RDX;
    local_18 = in_RSI;
    lVar2 = (**(code **)(*in_RSI + 0x38))();
    if (lVar2 == 0) {
      local_1 = 0;
    }
    else {
      ByteString::ByteString((ByteString *)0x1a9cda);
      uVar3 = (**(code **)(*local_18 + 0x38))();
      bVar1 = (**(code **)(*local_20 + 0x10))(local_20,local_48,uVar3 >> 3);
      if ((bVar1 & 1) == 0) {
        local_1 = 0;
      }
      else {
        local_1 = (**(code **)(*local_18 + 0x18))(local_18,local_48);
        local_1 = local_1 & 1;
      }
      ByteString::~ByteString((ByteString *)0x1a9d83);
    }
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool SymmetricAlgorithm::generateKey(SymmetricKey& key, RNG* rng /* = NULL */)
{
	if (rng == NULL)
	{
		return false;
	}

	if (key.getBitLen() == 0)
	{
		return false;
	}

	ByteString keyBits;

	if (!rng->generateRandom(keyBits, key.getBitLen()/8))
	{
		return false;
	}

	return key.setKeyBits(keyBits);
}